

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_dictionary.cpp
# Opt level: O3

BrotliSharedDictionaryInternal *
duckdb_brotli::BrotliSharedDictionaryCreateInstance
          (brotli_alloc_func alloc_func,brotli_free_func free_func,void *opaque)

{
  BrotliSharedDictionaryInternal *__s;
  BrotliDictionary *pBVar1;
  BrotliTransforms *pBVar2;
  
  if (alloc_func == (brotli_alloc_func)0x0 && free_func == (brotli_free_func)0x0) {
    __s = (BrotliSharedDictionaryInternal *)malloc(0x580);
  }
  else {
    if (alloc_func == (brotli_alloc_func)0x0 || free_func == (brotli_free_func)0x0) {
      return (BrotliSharedDictionaryInternal *)0x0;
    }
    __s = (BrotliSharedDictionaryInternal *)(*alloc_func)(opaque,0x580);
  }
  if (__s == (BrotliSharedDictionaryInternal *)0x0) {
    return (BrotliSharedDictionaryInternal *)0x0;
  }
  switchD_005681f0::default(__s,0,0x580);
  __s->num_dictionaries = '\x01';
  __s->num_transform_lists = '\0';
  pBVar1 = BrotliGetDictionary();
  __s->words[0] = pBVar1;
  pBVar2 = BrotliGetTransforms();
  if (alloc_func == (brotli_alloc_func)0x0) {
    alloc_func = BrotliDefaultAllocFunc;
  }
  __s->transforms[0] = pBVar2;
  __s->alloc_func = alloc_func;
  if (free_func == (brotli_free_func)0x0) {
    free_func = BrotliDefaultFreeFunc;
  }
  __s->free_func = free_func;
  __s->memory_manager_opaque = opaque;
  return __s;
}

Assistant:

BrotliSharedDictionary* duckdb_brotli::BrotliSharedDictionaryCreateInstance(
    brotli_alloc_func alloc_func, brotli_free_func free_func, void* opaque) {
  BrotliSharedDictionary* dict = 0;
  if (!alloc_func && !free_func) {
    dict = (BrotliSharedDictionary*)malloc(sizeof(BrotliSharedDictionary));
  } else if (alloc_func && free_func) {
    dict = (BrotliSharedDictionary*)alloc_func(
        opaque, sizeof(BrotliSharedDictionary));
  }
  if (dict == 0) {
    return 0;
  }

  /* TODO(eustas): explicitly initialize all the fields? */
  memset(dict, 0, sizeof(BrotliSharedDictionary));

  dict->context_based = BROTLI_FALSE;
  dict->num_dictionaries = 1;
  dict->num_word_lists = 0;
  dict->num_transform_lists = 0;

  dict->words[0] = BrotliGetDictionary();
  dict->transforms[0] = BrotliGetTransforms();

  dict->alloc_func = alloc_func ? alloc_func :  duckdb_brotli::BrotliDefaultAllocFunc;
  dict->free_func = free_func ? free_func :  duckdb_brotli::BrotliDefaultFreeFunc;
  dict->memory_manager_opaque = opaque;

  return dict;
}